

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O0

C_Node * bitor(C_Parser *parser,C_Token **rest,C_Token *tok)

{
  C_Node *tok_00;
  C_Token **parser_00;
  _Bool _Var1;
  C_Node *rhs;
  C_Token *start;
  C_Node *node;
  C_Token *tok_local;
  C_Token **rest_local;
  C_Parser *parser_local;
  
  node = (C_Node *)tok;
  tok_local = (C_Token *)rest;
  rest_local = (C_Token **)parser;
  start = (C_Token *)bitxor(parser,(C_Token **)&node,tok);
  while( true ) {
    _Var1 = C_equal((C_Token *)node,"|");
    parser_00 = rest_local;
    tok_00 = node;
    if (!_Var1) break;
    rhs = bitxor((C_Parser *)rest_local,(C_Token **)&node,(C_Token *)node->next);
    start = (C_Token *)
            new_binary((C_Parser *)parser_00,ND_BITOR,(C_Node *)start,rhs,(C_Token *)tok_00);
  }
  *(C_Node **)tok_local = node;
  return (C_Node *)start;
}

Assistant:

static C_Node *bitor(C_Parser *parser, C_Token **rest, C_Token *tok) {
  C_Node *node = bitxor(parser, &tok, tok);
  while (C_equal(tok, "|")) {
    C_Token *start = tok;
    node = new_binary(parser, ND_BITOR, node, bitxor(parser, &tok, tok->next), start);
  }
  *rest = tok;
  return node;
}